

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# div.h
# Opt level: O2

Context __thiscall
mp::
DivConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::Convert(DivConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
          *this,ItemType_conflict5 *dc,int param_2)

{
  double *pdVar1;
  double dVar2;
  int iVar3;
  FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *pFVar4;
  pointer pdVar5;
  pointer pdVar6;
  
  pFVar4 = (this->
           super_BasicFuncConstrCvt<mp::DivConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           ).
           super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           .mdl_cvt_;
  iVar3 = (dc->super_FunctionalConstraint).result_var_;
  pdVar5 = (pFVar4->
           super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           ).
           super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           .super_FlatModel<mp::DefaultFlatModelParams>.var_lb_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar6 = (pFVar4->
           super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           ).
           super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           .super_FlatModel<mp::DefaultFlatModelParams>.var_ub_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  dVar2 = pdVar5[iVar3];
  pdVar1 = pdVar6 + iVar3;
  if ((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) {
    iVar3 = (dc->super_CustomConstraintData<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::DivId>).
            args_._M_elems[1];
    dVar2 = pdVar5[iVar3];
    pdVar1 = pdVar6 + iVar3;
    if ((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) {
      ConvertWithNonConstDivisor(this,dc);
    }
    else {
      ConvertWithConstDivisor(this,dc);
    }
  }
  else {
    ConvertWithConstResult(this,dc);
  }
  return (Context)CTX_MIX;
}

Assistant:

Context Convert(const ItemType& dc, int ) {
    if (GetMC().is_fixed(dc.GetResultVar()))
      ConvertWithConstResult(dc);
    else if (GetMC().is_fixed(dc.GetArguments()[1]))
      ConvertWithConstDivisor(dc);
    else
      ConvertWithNonConstDivisor(dc);
    return Context::CTX_MIX;
  }